

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment.cpp
# Opt level: O3

void __thiscall
FragmentTest_MakeReadOnlySection_Test::~FragmentTest_MakeReadOnlySection_Test
          (FragmentTest_MakeReadOnlySection_Test *this)

{
  (this->super_FragmentTest).super_Test._vptr_Test = (_func_int **)&PTR__FragmentTest_0019ad28;
  std::
  _Rb_tree<unsigned_char_*,_std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>,_std::_Select1st<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>,_std::less<unsigned_char_*>,_std::allocator<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_char_*,_std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>,_std::_Select1st<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>,_std::less<unsigned_char_*>,_std::allocator<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>_>
               *)&(this->super_FragmentTest).transaction_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F (FragmentTest, MakeReadOnlySection) {
    std::array<section_content, 1> c = {{{section_kind::read_only, std::uint8_t{4} /*alignment*/}}};
    section_content & rodata = c.back ();
    rodata.data.assign ({'r', 'o', 'd', 'a', 't', 'a'});
    auto extent = build_fragment (transaction_, std::begin (c), std::end (c));

    ASSERT_EQ (transaction_.get_storage ().begin ()->first,
               reinterpret_cast<std::uint8_t const *> (extent.addr.absolute ()));
    auto f = reinterpret_cast<fragment const *> (transaction_.get_storage ().begin ()->first);

    std::vector<section_kind> const expected{section_kind::read_only};
    auto const indices = f->members ().get_indices ();
    std::vector<section_kind> const actual{std::begin (indices), std::end (indices)};
    EXPECT_THAT (actual, ::testing::ContainerEq (expected));

    generic_section const & s = f->at<section_kind::read_only> ();

    EXPECT_EQ (4U, section_alignment (s));
    EXPECT_EQ (6U, section_size (s));

    auto data_begin = std::begin (s.payload ());
    auto data_end = std::end (s.payload ());
    auto rodata_begin = std::begin (rodata.data);
    auto rodata_end = std::end (rodata.data);
    ASSERT_EQ (std::distance (data_begin, data_end), std::distance (rodata_begin, rodata_end));
    EXPECT_TRUE (std::equal (data_begin, data_end, rodata_begin));
    EXPECT_EQ (4U, s.align ());
    EXPECT_EQ (0U, s.ifixups ().size ());
    EXPECT_EQ (0U, s.xfixups ().size ());
    EXPECT_EQ (f->atp<section_kind::linked_definitions> (), nullptr);
}